

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

void __thiscall
Js::SegmentBTree::SwapSegment
          (SegmentBTree *this,uint32 originalKey,SparseArraySegmentBase *oldSeg,
          SparseArraySegmentBase *newSeg)

{
  SparseArraySegmentBase *pSVar1;
  SparseArraySegmentBase **ppSVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  undefined4 *puVar6;
  ulong uVar7;
  uint32 itemIndex;
  
  do {
    uVar7 = 0;
    if (this->segmentCount != 0) {
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      uVar7 = 0;
      do {
        pSVar1 = (this->segments).ptr[uVar7];
        if (((this->keys).ptr[uVar7] != pSVar1->left) && (pSVar1 != newSeg || oldSeg != newSeg)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar6 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                      ,0xd7,
                                      "(keys[i] == segments[i]->left || (oldSeg == newSeg && newSeg == segments[i]))"
                                      ,
                                      "keys[i] == segments[i]->left || (oldSeg == newSeg && newSeg == segments[i])"
                                     );
          if (!bVar4) goto LAB_00b78f68;
          *puVar6 = 0;
        }
      } while (((this->keys).ptr[uVar7] <= originalKey) &&
              (uVar7 = uVar7 + 1, (uint)uVar7 < this->segmentCount));
    }
    if ((int)uVar7 != 0) {
      ppSVar2 = (this->segments).ptr;
      uVar5 = (int)uVar7 - 1;
      if (ppSVar2[uVar5] == oldSeg) {
        ppSVar2[uVar5] = newSeg;
        (this->keys).ptr[uVar5] = newSeg->left;
        return;
      }
    }
    if ((this->children).ptr == (SegmentBTree *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0xea,"(!IsLeaf())","!IsLeaf()");
      if (!bVar4) {
LAB_00b78f68:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar6 = 0;
    }
    this = (this->children).ptr + (uVar7 & 0xffffffff);
  } while( true );
}

Assistant:

void SegmentBTree::SwapSegment(uint32 originalKey, SparseArraySegmentBase* oldSeg, SparseArraySegmentBase* newSeg)
    {
        // Find old segment
        uint32 itemIndex = originalKey;
        uint32 i = 0;

        for(; i < segmentCount; i++)
        {
            Assert(keys[i] == segments[i]->left || (oldSeg == newSeg && newSeg == segments[i]));
            if (itemIndex <  keys[i])
            {
                break;
            }
        }

        // i is 1 past any match

        if (i > 0)
        {
            if (oldSeg == segments[i-1])
            {
                segments[i-1] = newSeg;
                keys[i-1] = newSeg->left;
                return;
            }
        }

        Assert(!IsLeaf());
        children[i].SwapSegment(originalKey, oldSeg, newSeg);
    }